

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::CooperativeMatrixKHR::IsSameImpl
          (CooperativeMatrixKHR *this,Type *that,IsSameCache *seen)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  
  iVar2 = (*that->_vptr_Type[0x3a])(that);
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 != 0) {
    iVar2 = (*this->component_type_->_vptr_Type[2])
                      (this->component_type_,*(undefined8 *)(lVar3 + 0x28),seen);
    if (((((char)iVar2 != '\0') && (this->scope_id_ == *(uint32_t *)(lVar3 + 0x30))) &&
        (this->rows_id_ == *(uint32_t *)(lVar3 + 0x34))) &&
       ((this->columns_id_ == *(uint32_t *)(lVar3 + 0x38) &&
        (this->use_id_ == *(uint32_t *)(lVar3 + 0x3c))))) {
      bVar1 = analysis::Type::HasSameDecorations(&this->super_Type,that);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool CooperativeMatrixKHR::IsSameImpl(const Type* that,
                                      IsSameCache* seen) const {
  const CooperativeMatrixKHR* mt = that->AsCooperativeMatrixKHR();
  if (!mt) return false;
  return component_type_->IsSameImpl(mt->component_type_, seen) &&
         scope_id_ == mt->scope_id_ && rows_id_ == mt->rows_id_ &&
         columns_id_ == mt->columns_id_ && use_id_ == mt->use_id_ &&
         HasSameDecorations(that);
}